

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_bigint2.c
# Opt level: O3

int main(void)

{
  int iVar1;
  _PDCLIB_bigint_t expected;
  _PDCLIB_bigint_t big;
  _PDCLIB_bigint_t local_120;
  _PDCLIB_bigint_t local_98;
  
  local_98.size = 1;
  local_98.data[0] = 1;
  _PDCLIB_bigint32(&local_120,1);
  iVar1 = _PDCLIB_bigint_cmp(&local_98,&local_120);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint2.c, line %d - %s\n"
           ,0x2e,"_PDCLIB_bigint_cmp( &big, &expected ) == 0");
  }
  local_98.size = 1;
  local_98.data[0] = 8;
  _PDCLIB_bigint32(&local_120,8);
  iVar1 = _PDCLIB_bigint_cmp(&local_98,&local_120);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint2.c, line %d - %s\n"
           ,0x32,"_PDCLIB_bigint_cmp( &big, &expected ) == 0");
  }
  local_98.size = 2;
  local_98.data._0_4_ = 0x80000000;
  _PDCLIB_bigint32(&local_120,0x80000000);
  iVar1 = _PDCLIB_bigint_cmp(&local_98,&local_120);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint2.c, line %d - %s\n"
           ,0x36,"_PDCLIB_bigint_cmp( &big, &expected ) == 0");
  }
  local_98.size = 3;
  local_98.data._0_6_ = 0x100000000;
  _PDCLIB_bigint64(&local_120,1,0);
  iVar1 = _PDCLIB_bigint_cmp(&local_98,&local_120);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint2.c, line %d - %s\n"
           ,0x3a,"_PDCLIB_bigint_cmp( &big, &expected ) == 0");
  }
  local_98.size = 3;
  local_98.data._0_6_ = 0x400000000;
  _PDCLIB_bigint64(&local_120,4,0);
  iVar1 = _PDCLIB_bigint_cmp(&local_98,&local_120);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint2.c, line %d - %s\n"
           ,0x3e,"_PDCLIB_bigint_cmp( &big, &expected ) == 0");
  }
  local_98.size = 4;
  local_98.data[0] = 0;
  local_98.data[1] = 0;
  local_98.data[2] = 0;
  local_98.data[3] = 0x8000;
  _PDCLIB_bigint64(&local_120,0x80000000,0);
  iVar1 = _PDCLIB_bigint_cmp(&local_98,&local_120);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint2.c, line %d - %s\n"
           ,0x42,"_PDCLIB_bigint_cmp( &big, &expected ) == 0");
  }
  local_98.size = 5;
  local_98.data[4] = 1;
  local_98.data[0] = 0;
  local_98.data[1] = 0;
  local_98.data[2] = 0;
  local_98.data[3] = 0;
  _PDCLIB_bigint_mul_dig(&local_120,2);
  iVar1 = _PDCLIB_bigint_cmp(&local_98,&local_120);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint2.c, line %d - %s\n"
           ,0x46,"_PDCLIB_bigint_cmp( &big, &expected ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    _PDCLIB_bigint_t big, expected;
    _PDCLIB_bigint2( &big, 0 );
    _PDCLIB_bigint32( &expected, 1 );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );

    _PDCLIB_bigint2( &big, 3 );
    _PDCLIB_bigint32( &expected, 8 );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );

    _PDCLIB_bigint2( &big, 31 );
    _PDCLIB_bigint32( &expected, UINT32_C( 0x80000000 ) );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );

    _PDCLIB_bigint2( &big, 32 );
    _PDCLIB_bigint64( &expected, 1, 0 );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );

    _PDCLIB_bigint2( &big, 34 );
    _PDCLIB_bigint64( &expected, 4, 0 );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );

    _PDCLIB_bigint2( &big, 63 );
    _PDCLIB_bigint64( &expected, UINT32_C( 0x80000000 ), 0 );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );

    _PDCLIB_bigint2( &big, 64 );
    _PDCLIB_bigint_mul_dig( &expected, 2 );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );
#endif
    return TEST_RESULTS;
}